

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O1

int __thiscall mbc::Val::PersonHandle::remove(PersonHandle *this,char *__filename)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
  *this_00;
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  Str *pSVar4;
  undefined4 extraout_var;
  iterator __position;
  undefined4 extraout_var_00;
  iterator __it;
  undefined8 local_30;
  
  if (*(this->super_ValBase).is_vaild_ == true) {
    this_00 = &this->mb_->persons_->_M_t;
    pSVar4 = Person::ID(this->person_);
    iVar3 = (*(pSVar4->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar4);
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
                 ::find(this_00,(key_type *)CONCAT44(extraout_var,iVar3));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
    ::_M_erase_aux(&this->mb_->persons_->_M_t,(const_iterator)__position._M_node);
    p_Var1 = (_List_node_base *)this->mb_->order_;
    __it._M_node = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    pSVar4 = Person::ID(this->person_);
    iVar3 = (*(pSVar4->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar4);
    local_30 = CONCAT44(extraout_var_00,iVar3);
    if (__it._M_node != p_Var1) {
      do {
        bVar2 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                          ((_Iter_equals_val<std::__cxx11::string_const> *)&local_30,
                           (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )__it._M_node);
        if (bVar2) break;
        __it._M_node = (__it._M_node)->_M_next;
      } while (__it._M_node != p_Var1);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(this->mb_->order_,__it);
    MessageBook::save(this->mb_);
    reset_(this);
  }
  return (int)this;
}

Assistant:

PersonHandle& PersonHandle::remove() {
    if(*is_vaild_) {
        // remove self in mb_ -> persons_
        auto it_persons = mb_ -> persons_ -> find(person_ -> ID().raw());
        mb_ -> persons_ -> erase(it_persons);

        // remove self in mb_ -> order_
        auto it_order = std::find(mb_->order_->begin(), mb_->order_->end(), 
                                 person_ -> ID().raw() );
        mb_ -> order_ -> erase(it_order);

        // save messagebook and reset self, now it is unvaild
        mb_ -> save();
        reset_();
    } else {
        ; // do nothing
    }
    return *this;
}